

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_to_proto_test.cc
# Opt level: O0

Descriptor * upb_test::AddMessageDescriptor(MessageDefPtr msgdef,DescriptorPool *pool)

{
  bool bVar1;
  upb_FileDef *f;
  upb_Arena *puVar2;
  google_protobuf_FileDescriptorProto *msg;
  char *pcVar3;
  Descriptor *pDVar4;
  char *in_R9;
  string_view local_1b0;
  string local_1a0;
  AssertHelper local_180;
  Message local_178;
  bool local_169;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_;
  FileDescriptor *file_desc;
  FileDescriptorProto google_proto;
  char *buf;
  size_t size;
  google_protobuf_FileDescriptorProto *upb_proto;
  FileDefPtr local_30;
  FileDefPtr file;
  Arena tmp_arena;
  DescriptorPool *pool_local;
  MessageDefPtr msgdef_local;
  
  pool_local = (DescriptorPool *)msgdef.ptr_;
  upb::Arena::Arena((Arena *)&file);
  local_30 = upb::MessageDefPtr::file((MessageDefPtr *)&pool_local);
  f = upb::FileDefPtr::ptr(&local_30);
  puVar2 = upb::Arena::ptr((Arena *)&file);
  msg = upb_FileDef_ToProto(f,puVar2);
  size = (size_t)msg;
  puVar2 = upb::Arena::ptr((Arena *)&file);
  google_proto.field_0._224_8_ =
       google_protobuf_FileDescriptorProto_serialize(msg,puVar2,(size_t *)&buf);
  google::protobuf::FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&file_desc);
  google::protobuf::MessageLite::ParseFromArray
            ((MessageLite *)&file_desc,(void *)google_proto.field_0._224_8_,(int)buf);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )google::protobuf::DescriptorPool::BuildFile(pool,(FileDescriptorProto *)&file_desc);
  local_169 = (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               )0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_168,&local_169,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1a0,(internal *)local_168,(AssertionResult *)"file_desc != nullptr","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/util/def_to_proto_test.cc"
               ,0x2d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_180,&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    std::__cxx11::string::~string((string *)&local_1a0);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  pcVar3 = upb::MessageDefPtr::full_name((MessageDefPtr *)&pool_local);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1b0,pcVar3);
  pDVar4 = google::protobuf::DescriptorPool::FindMessageTypeByName(pool,local_1b0);
  google::protobuf::FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&file_desc);
  upb::Arena::~Arena((Arena *)&file);
  return pDVar4;
}

Assistant:

const google::protobuf::Descriptor* AddMessageDescriptor(
    upb::MessageDefPtr msgdef, google::protobuf::DescriptorPool* pool) {
  upb::Arena tmp_arena;
  upb::FileDefPtr file = msgdef.file();
  google_protobuf_FileDescriptorProto* upb_proto =
      upb_FileDef_ToProto(file.ptr(), tmp_arena.ptr());
  size_t size;
  const char* buf = google_protobuf_FileDescriptorProto_serialize(
      upb_proto, tmp_arena.ptr(), &size);
  google::protobuf::FileDescriptorProto google_proto;
  google_proto.ParseFromArray(buf, size);
  const google::protobuf::FileDescriptor* file_desc =
      pool->BuildFile(google_proto);
  EXPECT_TRUE(file_desc != nullptr);
  return pool->FindMessageTypeByName(msgdef.full_name());
}